

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

int __thiscall
unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::init
          (olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          EVP_PKEY_CTX *ctx)

{
  int iVar1;
  write_guard *in_RCX;
  optimistic_lock *in_RDX;
  write_guard *in_R9;
  
  if (in_RCX->lock != in_RDX) {
    __assert_fail("source_node_guard.guards(lock(source_node))",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x4d5,
                  "void unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>::init(db_type &, inode_16_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  if (in_R9->lock == (optimistic_lock *)0x0) {
    __assert_fail("child_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x4d6,
                  "void unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>::init(db_type &, inode_16_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  obsolete<unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             in_RDX,in_RCX);
  optimistic_lock::write_guard::unlock_and_obsolete(in_R9);
  iVar1 = basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::init(&this->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>,ctx);
  if (in_RCX->lock != (optimistic_lock *)0x0) {
    __assert_fail("!source_node_guard.active()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x4db,
                  "void unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>::init(db_type &, inode_16_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  if (in_R9->lock == (optimistic_lock *)0x0) {
    return iVar1;
  }
  __assert_fail("!child_guard.active()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x4dc,
                "void unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>::init(db_type &, inode_16_type &, unodb::optimistic_lock::write_guard &, std::uint8_t, unodb::optimistic_lock::write_guard &) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void olc_inode_4<Key, Value>::init(
    db_type& db_instance, inode_16_type& source_node,
    unodb::optimistic_lock::write_guard& source_node_guard,
    std::uint8_t child_to_delete,
    unodb::optimistic_lock::write_guard& child_guard) {
  UNODB_DETAIL_ASSERT(source_node_guard.guards(lock(source_node)));
  UNODB_DETAIL_ASSERT(child_guard.active());

  parent_class::init(db_instance, obsolete(source_node, source_node_guard),
                     obsolete_child_by_index(child_to_delete, child_guard));

  UNODB_DETAIL_ASSERT(!source_node_guard.active());
  UNODB_DETAIL_ASSERT(!child_guard.active());
}